

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O2

char * hts_idx_getfn(char *fn,char *ext)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  char *__dest;
  int iVar6;
  
  sVar1 = strlen(fn);
  sVar2 = strlen(ext);
  iVar6 = (int)sVar1;
  pcVar3 = (char *)calloc((long)((int)sVar2 + iVar6 + 1),1);
  strcpy(pcVar3,fn);
  strcpy(pcVar3 + iVar6,ext);
  pcVar4 = test_and_fetch(pcVar3);
  if (pcVar4 == (char *)0x0) {
    uVar5 = sVar1 & 0xffffffff;
    pcVar4 = pcVar3 + (iVar6 + -1);
    do {
      __dest = pcVar4;
      if ((int)uVar5 < 2) break;
      uVar5 = uVar5 - 1;
      pcVar4 = __dest + -1;
    } while (pcVar3[uVar5 & 0xffffffff] != '.');
    strcpy(__dest,ext);
    pcVar4 = test_and_fetch(pcVar3);
    if (pcVar4 == (char *)0x0) {
      free(pcVar3);
      return (char *)0x0;
    }
  }
  sVar1 = strlen(pcVar4);
  pcVar3 = (char *)memmove(pcVar3,pcVar4,(long)((sVar1 << 0x20) + 0x100000000) >> 0x20);
  return pcVar3;
}

Assistant:

char *hts_idx_getfn(const char *fn, const char *ext)
{
    int i, l_fn, l_ext;
    char *fnidx, *ret;
    l_fn = strlen(fn); l_ext = strlen(ext);
    fnidx = (char*)calloc(l_fn + l_ext + 1, 1);
    strcpy(fnidx, fn); strcpy(fnidx + l_fn, ext);
    if ((ret = test_and_fetch(fnidx)) == 0) {
        for (i = l_fn - 1; i > 0; --i)
            if (fnidx[i] == '.') break;
        strcpy(fnidx + i, ext);
        ret = test_and_fetch(fnidx);
    }
    if (ret == 0) {
        free(fnidx);
        return 0;
    }
    l_fn = strlen(ret);
    memmove(fnidx, ret, l_fn + 1);
    return fnidx;
}